

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunnonlinsol_newton.c
# Opt level: O3

int LSetup(N_Vector y,N_Vector f,int jbad,int *jcur,void *mem)

{
  double dVar1;
  SUNMatrix A;
  double *pdVar2;
  long *plVar3;
  double *pdVar4;
  double *pdVar5;
  int iVar6;
  undefined4 in_register_00000014;
  double dVar7;
  double dVar8;
  
  if (mem != (void *)0x0) {
    A = *(SUNMatrix *)((long)mem + 8);
    pdVar2 = *(double **)((long)y->content + 0x10);
    plVar3 = *(long **)((long)A->content + 0x20);
    dVar1 = *pdVar2;
    dVar7 = pdVar2[1];
    dVar8 = pdVar2[2];
    pdVar2 = (double *)*plVar3;
    *pdVar2 = dVar1 + dVar1;
    dVar7 = dVar7 + dVar7;
    pdVar4 = (double *)plVar3[1];
    *pdVar4 = dVar7;
    dVar8 = dVar8 + dVar8;
    pdVar5 = (double *)plVar3[2];
    *pdVar5 = dVar8;
    pdVar2[1] = dVar1 * 4.0;
    pdVar4[1] = dVar7;
    pdVar5[1] = -4.0;
    pdVar2[2] = dVar1 * 6.0;
    pdVar4[2] = -4.0;
    pdVar5[2] = dVar8;
    *jcur = 1;
    iVar6 = SUNLinSolSetup(*(SUNLinearSolver *)((long)mem + 0x10),A);
    return iVar6;
  }
  printf("ERROR: Integrator memory is NULL",f,CONCAT44(in_register_00000014,jbad));
  return -1;
}

Assistant:

int LSetup(N_Vector y, N_Vector f, booleantype jbad, booleantype* jcur, void* mem)
{
  int retval;
  IntegratorMem Imem;

  if (mem == NULL) {
    printf("ERROR: Integrator memory is NULL");
    return(-1);
  }
  Imem = (IntegratorMem) mem;

  /* compute the Jacobian */
  retval = Jac(ZERO, y, NULL, Imem->A, NULL, NULL, NULL, NULL);
  if (retval != 0) return(retval);

  /* update Jacobian status */
  *jcur = SUNTRUE;

  /* setup the linear solver */
  retval = SUNLinSolSetup(Imem->LS, Imem->A);

  return(retval);
}